

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_delsessionid(Curl_easy *data,void *ssl_sessionid)

{
  Curl_ssl_session *session;
  Curl_ssl_session *check;
  size_t i;
  void *ssl_sessionid_local;
  Curl_easy *data_local;
  
  check = (Curl_ssl_session *)0x0;
  while( true ) {
    if ((Curl_ssl_session *)(data->set).general_ssl.max_ssl_sessions <= check) {
      return;
    }
    session = (data->state).session + (long)check;
    if (session->sessionid == ssl_sessionid) break;
    check = (Curl_ssl_session *)((long)&check->name + 1);
  }
  Curl_ssl_kill_session(session);
  return;
}

Assistant:

void Curl_ssl_delsessionid(struct Curl_easy *data, void *ssl_sessionid)
{
  size_t i;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    struct Curl_ssl_session *check = &data->state.session[i];

    if(check->sessionid == ssl_sessionid) {
      Curl_ssl_kill_session(check);
      break;
    }
  }
}